

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmType GetVmType(ExpressionContext *ctx,TypeBase *type)

{
  undefined4 in_EAX;
  int iVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  VmType VVar4;
  
  if (ctx->typeVoid == type) {
    uVar2 = 0;
    goto LAB_001978d6;
  }
  auVar3._0_4_ = -(uint)(type == ctx->typeBool);
  auVar3._4_4_ = -(uint)(type == ctx->typeChar);
  auVar3._8_4_ = -(uint)(type == ctx->typeShort);
  auVar3._12_4_ = -(uint)(type == ctx->typeInt);
  iVar1 = movmskps(in_EAX,auVar3);
  if (iVar1 != 0) {
switchD_0019791f_caseD_9:
    return (VmType)ZEXT816(0x400000001);
  }
  if (ctx->typeLong == type) {
    uVar2 = 0x800000003;
    goto LAB_001978d6;
  }
  if (ctx->typeFloat == type) {
    return (VmType)ZEXT816(0x800000002);
  }
  if (ctx->typeDouble == type) {
    return (VmType)ZEXT816(0x800000002);
  }
  if (type == (TypeBase *)0x0) {
switchD_0019791f_caseD_c:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x9b2,"VmType GetVmType(ExpressionContext &, TypeBase *)");
  }
  switch(type->typeID) {
  case 9:
  case 10:
  case 0x19:
    goto switchD_0019791f_caseD_9;
  case 0xb:
  case 0x12:
    VVar4 = VmType::Pointer(type);
    break;
  default:
    goto switchD_0019791f_caseD_c;
  case 0x10:
    uVar2 = 0xc00000009;
    goto LAB_001978d6;
  case 0x11:
    uVar2 = 0x100000000a;
LAB_001978d6:
    VVar4.structType = (TypeBase *)0x0;
    VVar4.type = (int)uVar2;
    VVar4.size = (int)(uVar2 >> 0x20);
    break;
  case 0x13:
  case 0x18:
    uVar2 = type->size;
    if ((uVar2 & 3) != 0) {
      __assert_fail("type->size % 4 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x9a9,"VmType GetVmType(ExpressionContext &, TypeBase *)");
    }
    if (0xfffffff < (long)uVar2) {
      __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x9aa,"VmType GetVmType(ExpressionContext &, TypeBase *)");
    }
    VVar4 = VmType::Struct(uVar2,type);
    break;
  case 0x14:
    VVar4 = VmType::ArrayRef(type);
    break;
  case 0x15:
    VVar4 = VmType::FunctionRef(type);
  }
  return VVar4;
}

Assistant:

VmType GetVmType(ExpressionContext &ctx, TypeBase *type)
{
	if(type == ctx.typeVoid)
		return VmType::Void;

	if(type == ctx.typeBool || type == ctx.typeChar || type == ctx.typeShort || type == ctx.typeInt)
		return VmType::Int;

	if(type == ctx.typeLong)
		return VmType::Long;

	if(type == ctx.typeFloat || type == ctx.typeDouble)
		return VmType::Double;

	if(isType<TypeRef>(type))
		return VmType::Pointer(type);

	if(isType<TypeFunction>(type))
		return VmType::FunctionRef(type);

	if(isType<TypeUnsizedArray>(type))
		return VmType::ArrayRef(type);

	if(isType<TypeAutoRef>(type))
		return VmType::AutoRef;

	if(isType<TypeAutoArray>(type))
		return VmType::AutoArray;

	if(isType<TypeTypeID>(type))
		return VmType::Int;

	if(isType<TypeFunctionID>(type))
		return VmType::Int;

	if(isType<TypeNullptr>(type))
		return VmType::Pointer(type);

	if(isType<TypeArray>(type) || isType<TypeClass>(type))
	{
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VmType::Struct(type->size, type);
	}

	if(isType<TypeEnum>(type))
		return VmType::Int;

	assert(!"unknown type");

	return VmType::Void;
}